

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

void __thiscall
rengine::mat4::mat4(mat4 *this,float m11,float m12,float m13,float m14,float m21,float m22,float m23
                   ,float m24,float m31,float m32,float m33,float m34,float m41,float m42,float m43,
                   float m44,uint type)

{
  uint type_local;
  float m24_local;
  float m23_local;
  float m22_local;
  float m21_local;
  float m14_local;
  float m13_local;
  float m12_local;
  float m11_local;
  mat4 *this_local;
  
  this->m[0] = m11;
  this->m[1] = m12;
  this->m[2] = m13;
  this->m[3] = m14;
  this->m[4] = m21;
  this->m[5] = m22;
  this->m[6] = m23;
  this->m[7] = m24;
  this->m[8] = m31;
  this->m[9] = m32;
  this->m[10] = m33;
  this->m[0xb] = m34;
  this->m[0xc] = m41;
  this->m[0xd] = m42;
  this->m[0xe] = m43;
  this->m[0xf] = m44;
  this->type = type;
  return;
}

Assistant:

mat4(float m11, float m12, float m13, float m14,
         float m21, float m22, float m23, float m24,
         float m31, float m32, float m33, float m34,
         float m41, float m42, float m43, float m44,
         unsigned type = Generic)
        : m{ m11, m12, m13, m14,
             m21, m22, m23, m24,
             m31, m32, m33, m34,
             m41, m42, m43, m44 }
        , type(type)
    {
    }